

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O2

string * __thiscall
trial::protocol::json::detail::string_converter<char,float>::encode_abi_cxx11_
          (string *__return_storage_ptr__,string_converter<char,float> *this,float value)

{
  uint *puVar1;
  string work;
  ostringstream stream;
  locale local_1b0 [8];
  long local_1a8;
  long local_1a0;
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::locale::classic();
  std::ios::imbue(local_1b0);
  std::locale::~locale(local_1b0);
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188 + -0x18));
  *puVar1 = *puVar1 | 0x400;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 6;
  std::ostream::operator<<((ostream *)&local_188,value);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,local_1a8,local_1a0 + local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

static string encode(float value)
    {
        // Workaround for CharT = unsigned char, which std::locale does not support
        std::ostringstream stream;
        stream.imbue(std::locale::classic());
        stream << std::showpoint << std::setprecision(std::numeric_limits<float>::digits10) << value;
        std::string work = stream.str();
        return {work.begin(), work.end()};
    }